

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  buffer_appender<char> bVar12;
  int iVar13;
  size_type sVar14;
  ulong uVar15;
  ulong uVar16;
  buffer<char> *buf;
  _Alloc_hider _Var17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_2a8;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *local_288;
  char *local_280;
  char acStack_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_2a8,(locale_ref)(this->locale).locale_);
  if (local_2a8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar9 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar9 != '\0') {
      uVar15 = this->abs_value;
      lVar8 = 0x3f;
      if ((uVar15 | 1) != 0) {
        for (; (uVar15 | 1) >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      uVar4 = *(ushort *)(&DAT_0011f6b0 + (uint)((int)lVar8 * 2));
      bVar7 = uVar15 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar4 * 8);
      uVar22 = (uint)uVar4 - (uint)bVar7;
      uVar20 = uVar22;
      uVar11 = uVar22;
      if (local_2a8._M_string_length != 0) {
        uVar20 = uVar22 + (int)local_2a8._M_string_length;
        sVar14 = 0;
        uVar10 = uVar22;
        do {
          cVar2 = local_2a8._M_dataplus._M_p[sVar14];
          uVar11 = uVar10 - (int)cVar2;
          if ((uVar11 == 0 || (int)uVar10 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
            iVar13 = (int)sVar14 + uVar22;
            goto LAB_00119762;
          }
          sVar14 = sVar14 + 1;
          uVar10 = uVar11;
        } while (local_2a8._M_string_length != sVar14);
      }
      iVar13 = (int)(uVar11 - 1) / (int)local_2a8._M_dataplus._M_p[local_2a8._M_string_length - 1] +
               uVar20;
LAB_00119762:
      pcVar18 = acStack_278 + (int)uVar22;
      uVar19 = uVar15;
      if (99 < uVar15) {
        do {
          uVar15 = uVar19 / 100;
          *(undefined2 *)(pcVar18 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar19 % 100) * 2);
          pcVar18 = pcVar18 + -2;
          bVar6 = 9999 < uVar19;
          uVar19 = uVar15;
        } while (bVar6);
      }
      if (uVar15 < 10) {
        pcVar18[-1] = (byte)uVar15 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar18 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar15 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0012aca8;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar20 = iVar13 + this->prefix_size;
      if (-1 < (int)uVar20) {
        uVar15 = (ulong)uVar20;
        if (500 < uVar20) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar15);
        }
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (uVar15 <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = uVar15;
        }
        pcVar18 = local_248.super_buffer<char>.ptr_ + uVar15;
        if (0 < (int)uVar22) {
          uVar19 = (ulong)uVar22;
          iVar21 = ((uint)uVar4 - (uint)bVar7) + 1;
          iVar13 = 0;
          _Var17._M_p = local_2a8._M_dataplus._M_p;
          do {
            uVar19 = uVar19 - 1;
            pcVar1 = pcVar18 + -1;
            pcVar18[-1] = acStack_278[uVar19 & 0xffffffff];
            cVar2 = *_Var17._M_p;
            if (0 < cVar2) {
              iVar13 = iVar13 + 1;
              if ((cVar2 != '\x7f') && (iVar13 % (int)cVar2 == 0)) {
                if (_Var17._M_p + 1 != local_2a8._M_dataplus._M_p + local_2a8._M_string_length) {
                  iVar13 = 0;
                  _Var17._M_p = _Var17._M_p + 1;
                }
                pcVar18[-2] = cVar9;
                pcVar1 = pcVar18 + -2;
              }
            }
            pcVar18 = pcVar1;
            iVar21 = iVar21 + -1;
          } while (1 < iVar21);
        }
        if (this->prefix_size != 0) {
          pcVar18[-1] = 0x2d;
        }
        pbVar5 = this->specs;
        uVar19 = (ulong)pbVar5->width;
        if (-1 < (long)uVar19) {
          local_280 = local_248.super_buffer<char>.ptr_;
          uVar16 = 0;
          if (uVar15 <= uVar19) {
            uVar16 = uVar19 - uVar15;
          }
          bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          local_288 = this;
          if (*(ulong *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + uVar15 + (pbVar5->fill).size_ * uVar16) {
            (*(code *)**(undefined8 **)
                        bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar19 = uVar16 >> (bVar3 & 0x3f);
          bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar19,&pbVar5->fill);
          bVar12 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (local_280,local_280 + uVar15,bVar12);
          bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar12,uVar16 - uVar19,&pbVar5->fill);
          (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0012aca8;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_
                           );
          }
          goto LAB_00119995;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/3rdparty/fmt/include/fmt/core.h"
                  ,0x13d,"negative value");
    }
    on_dec(this);
  }
LAB_00119995:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }